

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O3

void __thiscall
SceneRender::commandsInit(SceneRender *this,CommandList *_commands,Uniforms *_uniforms)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  string local_298;
  string local_278;
  string local_258;
  Command local_238;
  _Any_data local_1b0;
  code *local_1a0;
  code *local_198;
  _Any_data local_190;
  code *local_180;
  code *local_178;
  _Any_data local_170;
  code *local_160;
  code *local_158;
  _Any_data local_150;
  code *local_140;
  code *local_138;
  _Any_data local_130;
  code *local_120;
  code *local_118;
  _Any_data local_110;
  code *local_100;
  code *local_f8;
  _Any_data local_f0;
  code *local_e0;
  code *local_d8;
  _Any_data local_d0;
  code *local_c0;
  code *local_b8;
  _Any_data local_b0;
  code *local_a0;
  code *local_98;
  _Any_data local_90;
  code *local_80;
  code *local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  if (this->m_commands_loaded == false) {
    paVar1 = &local_258.field_2;
    local_258._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"model","");
    local_50._8_8_ = 0;
    local_38 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:61:46)>
               ::_M_invoke;
    local_40 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:61:46)>
               ::_M_manager;
    paVar2 = &local_278.field_2;
    local_278._M_dataplus._M_p = (pointer)paVar2;
    local_50._M_unused._M_object = _uniforms;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"models","");
    paVar3 = &local_298.field_2;
    local_298._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_298,"print all the names of the models","");
    Command::Command(&local_238,&local_258,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_50,&local_278,&local_298,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_238);
    if (local_238.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_238.exec.super__Function_base._M_manager)
                ((_Any_data *)&local_238.exec,(_Any_data *)&local_238.exec,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.description._M_dataplus._M_p != &local_238.description.field_2) {
      operator_delete(local_238.description._M_dataplus._M_p,
                      local_238.description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.formula._M_dataplus._M_p != &local_238.formula.field_2) {
      operator_delete(local_238.formula._M_dataplus._M_p,
                      local_238.formula.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.trigger._M_dataplus._M_p != &local_238.trigger.field_2) {
      operator_delete(local_238.trigger._M_dataplus._M_p,
                      local_238.trigger.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar3) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    local_258._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"origin","");
    local_70._8_8_ = 0;
    local_58 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:93:47)>
               ::_M_invoke;
    local_60 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:93:47)>
               ::_M_manager;
    local_278._M_dataplus._M_p = (pointer)paVar2;
    local_70._M_unused._M_object = this;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"origin[,<x>,<y>,<z>]","");
    local_298._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_298,"get or set the origin position.","");
    Command::Command(&local_238,&local_258,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_70,&local_278,&local_298,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_238);
    if (local_238.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_238.exec.super__Function_base._M_manager)
                ((_Any_data *)&local_238.exec,(_Any_data *)&local_238.exec,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.description._M_dataplus._M_p != &local_238.description.field_2) {
      operator_delete(local_238.description._M_dataplus._M_p,
                      local_238.description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.formula._M_dataplus._M_p != &local_238.formula.field_2) {
      operator_delete(local_238.formula._M_dataplus._M_p,
                      local_238.formula.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.trigger._M_dataplus._M_p != &local_238.trigger.field_2) {
      operator_delete(local_238.trigger._M_dataplus._M_p,
                      local_238.trigger.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar3) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if (local_60 != (code *)0x0) {
      (*local_60)(&local_70,&local_70,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    local_258._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"material","");
    local_90._8_8_ = 0;
    local_78 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:108:49)>
               ::_M_invoke;
    local_80 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:108:49)>
               ::_M_manager;
    local_278._M_dataplus._M_p = (pointer)paVar2;
    local_90._M_unused._M_object = _uniforms;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"materials","");
    local_298._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_298,"print all the materials names","");
    Command::Command(&local_238,&local_258,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_90,&local_278,&local_298,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_238);
    if (local_238.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_238.exec.super__Function_base._M_manager)
                ((_Any_data *)&local_238.exec,(_Any_data *)&local_238.exec,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.description._M_dataplus._M_p != &local_238.description.field_2) {
      operator_delete(local_238.description._M_dataplus._M_p,
                      local_238.description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.formula._M_dataplus._M_p != &local_238.formula.field_2) {
      operator_delete(local_238.formula._M_dataplus._M_p,
                      local_238.formula.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.trigger._M_dataplus._M_p != &local_238.trigger.field_2) {
      operator_delete(local_238.trigger._M_dataplus._M_p,
                      local_238.trigger.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar3) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if (local_80 != (code *)0x0) {
      (*local_80)(&local_90,&local_90,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    local_258._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"blend","");
    local_b0._8_8_ = 0;
    local_98 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:130:46)>
               ::_M_invoke;
    local_a0 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:130:46)>
               ::_M_manager;
    local_278._M_dataplus._M_p = (pointer)paVar2;
    local_b0._M_unused._M_object = this;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_278,"blend[,alpha|add|multiply|screen|substract]","");
    local_298._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_298,"get or set the blending modes","");
    Command::Command(&local_238,&local_258,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_b0,&local_278,&local_298,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_238);
    if (local_238.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_238.exec.super__Function_base._M_manager)
                ((_Any_data *)&local_238.exec,(_Any_data *)&local_238.exec,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.description._M_dataplus._M_p != &local_238.description.field_2) {
      operator_delete(local_238.description._M_dataplus._M_p,
                      local_238.description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.formula._M_dataplus._M_p != &local_238.formula.field_2) {
      operator_delete(local_238.formula._M_dataplus._M_p,
                      local_238.formula.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.trigger._M_dataplus._M_p != &local_238.trigger.field_2) {
      operator_delete(local_238.trigger._M_dataplus._M_p,
                      local_238.trigger.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar3) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if (local_a0 != (code *)0x0) {
      (*local_a0)(&local_b0,&local_b0,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    local_258._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"depth_test","");
    local_d0._8_8_ = 0;
    local_b8 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:157:51)>
               ::_M_invoke;
    local_c0 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:157:51)>
               ::_M_manager;
    local_278._M_dataplus._M_p = (pointer)paVar2;
    local_d0._M_unused._M_object = this;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"depth_test[,on|off]","");
    local_298._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_298,"turn on/off depth test","");
    Command::Command(&local_238,&local_258,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_d0,&local_278,&local_298,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_238);
    if (local_238.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_238.exec.super__Function_base._M_manager)
                ((_Any_data *)&local_238.exec,(_Any_data *)&local_238.exec,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.description._M_dataplus._M_p != &local_238.description.field_2) {
      operator_delete(local_238.description._M_dataplus._M_p,
                      local_238.description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.formula._M_dataplus._M_p != &local_238.formula.field_2) {
      operator_delete(local_238.formula._M_dataplus._M_p,
                      local_238.formula.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.trigger._M_dataplus._M_p != &local_238.trigger.field_2) {
      operator_delete(local_238.trigger._M_dataplus._M_p,
                      local_238.trigger.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar3) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if (local_c0 != (code *)0x0) {
      (*local_c0)(&local_d0,&local_d0,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    local_258._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"culling","");
    local_f0._8_8_ = 0;
    local_d8 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:174:48)>
               ::_M_invoke;
    local_e0 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:174:48)>
               ::_M_manager;
    local_278._M_dataplus._M_p = (pointer)paVar2;
    local_f0._M_unused._M_object = this;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_278,"culling[,none|front|back|both]","");
    local_298._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_298,"get or set the culling modes","");
    Command::Command(&local_238,&local_258,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_f0,&local_278,&local_298,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_238);
    if (local_238.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_238.exec.super__Function_base._M_manager)
                ((_Any_data *)&local_238.exec,(_Any_data *)&local_238.exec,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.description._M_dataplus._M_p != &local_238.description.field_2) {
      operator_delete(local_238.description._M_dataplus._M_p,
                      local_238.description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.formula._M_dataplus._M_p != &local_238.formula.field_2) {
      operator_delete(local_238.formula._M_dataplus._M_p,
                      local_238.formula.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.trigger._M_dataplus._M_p != &local_238.trigger.field_2) {
      operator_delete(local_238.trigger._M_dataplus._M_p,
                      local_238.trigger.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar3) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if (local_e0 != (code *)0x0) {
      (*local_e0)(&local_f0,&local_f0,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    local_258._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"dynamic_shadows","");
    local_110._8_8_ = 0;
    local_f8 = std::
               _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:197:56)>
               ::_M_invoke;
    local_100 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:197:56)>
                ::_M_manager;
    local_278._M_dataplus._M_p = (pointer)paVar2;
    local_110._M_unused._M_object = this;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_278,"dynamic_shadows[,on|off]","");
    local_298._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_298,"get or set dynamic shadows","");
    Command::Command(&local_238,&local_258,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_110,&local_278,&local_298,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_238);
    if (local_238.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_238.exec.super__Function_base._M_manager)
                ((_Any_data *)&local_238.exec,(_Any_data *)&local_238.exec,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.description._M_dataplus._M_p != &local_238.description.field_2) {
      operator_delete(local_238.description._M_dataplus._M_p,
                      local_238.description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.formula._M_dataplus._M_p != &local_238.formula.field_2) {
      operator_delete(local_238.formula._M_dataplus._M_p,
                      local_238.formula.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.trigger._M_dataplus._M_p != &local_238.trigger.field_2) {
      operator_delete(local_238.trigger._M_dataplus._M_p,
                      local_238.trigger.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar3) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if (local_100 != (code *)0x0) {
      (*local_100)(&local_110,&local_110,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    local_258._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"floor_color","");
    local_118 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:214:52)>
                ::_M_invoke;
    local_120 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:214:52)>
                ::_M_manager;
    local_278._M_dataplus._M_p = (pointer)paVar2;
    local_130._M_unused._M_object = this;
    local_130._8_8_ = _uniforms;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_278,"floor_color[,<r>,<g>,<b>]","");
    local_298._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_298,"get or set the ground color of the skybox.","");
    Command::Command(&local_238,&local_258,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_130,&local_278,&local_298,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_238);
    if (local_238.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_238.exec.super__Function_base._M_manager)
                ((_Any_data *)&local_238.exec,(_Any_data *)&local_238.exec,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.description._M_dataplus._M_p != &local_238.description.field_2) {
      operator_delete(local_238.description._M_dataplus._M_p,
                      local_238.description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.formula._M_dataplus._M_p != &local_238.formula.field_2) {
      operator_delete(local_238.formula._M_dataplus._M_p,
                      local_238.formula.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.trigger._M_dataplus._M_p != &local_238.trigger.field_2) {
      operator_delete(local_238.trigger._M_dataplus._M_p,
                      local_238.trigger.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar3) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if (local_120 != (code *)0x0) {
      (*local_120)(&local_130,&local_130,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    local_258._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"floor","");
    local_150._8_8_ = 0;
    local_138 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:233:46)>
                ::_M_invoke;
    local_140 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:233:46)>
                ::_M_manager;
    local_278._M_dataplus._M_p = (pointer)paVar2;
    local_150._M_unused._M_object = this;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_278,"floor[,on|off|<subD_level>]","");
    local_298._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_298,"show/hide floor or presice the subdivision level","");
    Command::Command(&local_238,&local_258,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_150,&local_278,&local_298,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_238);
    if (local_238.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_238.exec.super__Function_base._M_manager)
                ((_Any_data *)&local_238.exec,(_Any_data *)&local_238.exec,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.description._M_dataplus._M_p != &local_238.description.field_2) {
      operator_delete(local_238.description._M_dataplus._M_p,
                      local_238.description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.formula._M_dataplus._M_p != &local_238.formula.field_2) {
      operator_delete(local_238.formula._M_dataplus._M_p,
                      local_238.formula.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.trigger._M_dataplus._M_p != &local_238.trigger.field_2) {
      operator_delete(local_238.trigger._M_dataplus._M_p,
                      local_238.trigger.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar3) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if (local_140 != (code *)0x0) {
      (*local_140)(&local_150,&local_150,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    local_258._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"grid","");
    local_170._8_8_ = 0;
    local_158 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:261:45)>
                ::_M_invoke;
    local_160 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:261:45)>
                ::_M_manager;
    local_278._M_dataplus._M_p = (pointer)paVar2;
    local_170._M_unused._M_object = this;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"grid[,on|off]","");
    local_298._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"show/hide grid","");
    Command::Command(&local_238,&local_258,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_170,&local_278,&local_298,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_238);
    if (local_238.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_238.exec.super__Function_base._M_manager)
                ((_Any_data *)&local_238.exec,(_Any_data *)&local_238.exec,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.description._M_dataplus._M_p != &local_238.description.field_2) {
      operator_delete(local_238.description._M_dataplus._M_p,
                      local_238.description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.formula._M_dataplus._M_p != &local_238.formula.field_2) {
      operator_delete(local_238.formula._M_dataplus._M_p,
                      local_238.formula.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.trigger._M_dataplus._M_p != &local_238.trigger.field_2) {
      operator_delete(local_238.trigger._M_dataplus._M_p,
                      local_238.trigger.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar3) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if (local_160 != (code *)0x0) {
      (*local_160)(&local_170,&local_170,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    local_258._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"axis","");
    local_190._8_8_ = 0;
    local_178 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:281:45)>
                ::_M_invoke;
    local_180 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:281:45)>
                ::_M_manager;
    local_278._M_dataplus._M_p = (pointer)paVar2;
    local_190._M_unused._M_object = this;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"axis[,on|off]","");
    local_298._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"show/hide axis","");
    Command::Command(&local_238,&local_258,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_190,&local_278,&local_298,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_238);
    if (local_238.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_238.exec.super__Function_base._M_manager)
                ((_Any_data *)&local_238.exec,(_Any_data *)&local_238.exec,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.description._M_dataplus._M_p != &local_238.description.field_2) {
      operator_delete(local_238.description._M_dataplus._M_p,
                      local_238.description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.formula._M_dataplus._M_p != &local_238.formula.field_2) {
      operator_delete(local_238.formula._M_dataplus._M_p,
                      local_238.formula.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.trigger._M_dataplus._M_p != &local_238.trigger.field_2) {
      operator_delete(local_238.trigger._M_dataplus._M_p,
                      local_238.trigger.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar3) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if (local_180 != (code *)0x0) {
      (*local_180)(&local_190,&local_190,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    local_258._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"bboxes","");
    local_1b0._8_8_ = 0;
    local_198 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:301:47)>
                ::_M_invoke;
    local_1a0 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sceneRender.cpp:301:47)>
                ::_M_manager;
    local_278._M_dataplus._M_p = (pointer)paVar2;
    local_1b0._M_unused._M_object = this;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"bboxes[,on|off]","");
    local_298._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_298,"show/hide models bounding boxes","");
    Command::Command(&local_238,&local_258,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_1b0,&local_278,&local_298,true);
    std::vector<Command,_std::allocator<Command>_>::emplace_back<Command>(_commands,&local_238);
    if (local_238.exec.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_238.exec.super__Function_base._M_manager)
                ((_Any_data *)&local_238.exec,(_Any_data *)&local_238.exec,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.description._M_dataplus._M_p != &local_238.description.field_2) {
      operator_delete(local_238.description._M_dataplus._M_p,
                      local_238.description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.formula._M_dataplus._M_p != &local_238.formula.field_2) {
      operator_delete(local_238.formula._M_dataplus._M_p,
                      local_238.formula.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.trigger._M_dataplus._M_p != &local_238.trigger.field_2) {
      operator_delete(local_238.trigger._M_dataplus._M_p,
                      local_238.trigger.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar3) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if (local_1a0 != (code *)0x0) {
      (*local_1a0)(&local_1b0,&local_1b0,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    this->m_commands_loaded = true;
  }
  return;
}

Assistant:

void SceneRender::commandsInit(CommandList& _commands, Uniforms& _uniforms) {
    if (!m_commands_loaded) {

        // ADD COMMANDS
        // ----------------------------------------- 
        _commands.push_back(Command("model", [&](const std::string& _line){ 
            if (_line == "models") {
                for (vera::ModelsMap::iterator it = _uniforms.models.begin(); it != _uniforms.models.end(); ++it)
                    std::cout << it->second->getName() << std::endl;
                return true;
            }
            else {
                std::vector<std::string> values = vera::split(_line,',');
                if (values.size() == 2) {
                    for (vera::ModelsMap::iterator it = _uniforms.models.begin(); it != _uniforms.models.end(); ++it)
                        if (it->second->getName() == values[1]) {
                            it->second->printVboInfo();
                            std::cout << "Defines:" << std::endl;
                            it->second->printDefines();
                            std::cout << "Position:" << std::endl;
                            glm::vec3 pos = it->second->getPosition();
                            std::cout << pos.x << ',' << pos.y << ',' << pos.z << std::endl;
                            return true;
                        }
                }
                else if (values.size() == 5) {
                    for (vera::ModelsMap::iterator it = _uniforms.models.begin(); it != _uniforms.models.end(); ++it)
                        if (it->second->getName() == values[1]) {
                            it->second->setPosition( glm::vec3(vera::toFloat(values[2]), vera::toFloat(values[3]), vera::toFloat(values[4])) );
                            return true;
                        }
                }
            }
            return false;
        },
        "models", "print all the names of the models"));

        _commands.push_back(Command("origin", [&](const std::string& _line){ 
            std::vector<std::string> values = vera::split(_line,',');
            if (values.size() == 4) {
                m_origin.setPosition( glm::vec3(vera::toFloat(values[1]), vera::toFloat(values[2]), vera::toFloat(values[3])) );
                return true;
            }
            else {
                glm::vec3 pos = m_origin.getPosition();
                std::cout << pos.x << ',' << pos.y << ',' << pos.z << std::endl;
                return true;
            }
            return false;
        },
        "origin[,<x>,<y>,<z>]", "get or set the origin position."));

        _commands.push_back(Command("material", [&](const std::string& _line){ 
            if (_line == "materials") {
                for (vera::MaterialsMap::iterator it = _uniforms.materials.begin(); it != _uniforms.materials.end(); it++)
                    std::cout << it->second->name << std::endl;
                return true;
            }
            else {
                std::vector<std::string> values = vera::split(_line,',');
                if (values.size() == 2 && values[0] == "material") {
                    for (vera::MaterialsMap::iterator it = _uniforms.materials.begin(); it != _uniforms.materials.end(); it++) {
                        if (it->second->name == values[1]) {
                            it->second->printDefines();
                            return true;
                        }
                    }
                }
            }

            return false;
        },
        "materials", "print all the materials names"));

        _commands.push_back(Command("blend", [&](const std::string& _line){ 
            std::vector<std::string> values = vera::split(_line,',');
            if (values.size() == 1) {
                if (getBlend() == vera::BLEND_NONE) std::cout << "none" << std::endl;
                else if (getBlend() == vera::BLEND_ALPHA) std::cout << "alpha" << std::endl;
                else if (getBlend() == vera::BLEND_ADD) std::cout << "add" << std::endl;
                else if (getBlend() == vera::BLEND_MULTIPLY) std::cout << "multiply" << std::endl;
                else if (getBlend() == vera::BLEND_SCREEN) std::cout << "screen" << std::endl;
                else if (getBlend() == vera::BLEND_SUBSTRACT) std::cout << "substract" << std::endl;
                
                return true;
            }
            else if (values.size() == 2) {
                if (values[1] == "none" || values[1] == "off") setBlend(vera::BLEND_NONE);
                else if (values[1] == "alpha") setBlend(vera::BLEND_ALPHA);
                else if (values[1] == "add") setBlend(vera::BLEND_ADD);
                else if (values[1] == "multiply") setBlend(vera::BLEND_MULTIPLY);
                else if (values[1] == "screen") setBlend(vera::BLEND_SCREEN);
                else if (values[1] == "substract") setBlend(vera::BLEND_SUBSTRACT);

                return true;
            }

            return false;
        },
        "blend[,alpha|add|multiply|screen|substract]", "get or set the blending modes"));

        _commands.push_back(Command("depth_test", [&](const std::string& _line){ 
            if (_line == "depth_test") {
                std::string rta = m_depth_test ? "on" : "off";
                std::cout <<  rta << std::endl; 
                return true;
            }
            else {
                std::vector<std::string> values = vera::split(_line,',');
                if (values.size() == 2) {
                    m_depth_test = (values[1] == "on");
                    return true;
                }
            }
            return false;
        },
        "depth_test[,on|off]", "turn on/off depth test"));

        _commands.push_back(Command("culling", [&](const std::string& _line){ 
            std::vector<std::string> values = vera::split(_line,',');
            if (values.size() == 1) {
                if (getCulling() == vera::CULL_NONE) std::cout << "none" << std::endl;
                else if (getCulling() == vera::CULL_FRONT) std::cout << "front" << std::endl;
                else if (getCulling() == vera::CULL_BACK) std::cout << "back" << std::endl;
                else if (getCulling() == vera::CULL_BOTH) std::cout << "both" << std::endl;

                return true;
            }
            else if (values.size() == 2) {
                if (values[1] == "none") setCulling(vera::CULL_NONE);
                else if (values[1] == "front") setCulling(vera::CULL_FRONT);
                else if (values[1] == "back") setCulling(vera::CULL_BACK);
                else if (values[1] == "both") setCulling(vera::CULL_BOTH);

                return true;
            }

            return false;
        },
        "culling[,none|front|back|both]", "get or set the culling modes"));
        
        _commands.push_back(Command("dynamic_shadows", [&](const std::string& _line){ 
            if (_line == "dynamic_shadows") {
                std::string rta = dynamicShadows ? "on" : "off";
                std::cout <<  rta << std::endl; 
                return true;
            }
            else {
                std::vector<std::string> values = vera::split(_line,',');
                if (values.size() == 2) {
                    dynamicShadows = (values[1] == "on");
                    return true;
                }
            }
            return false;
        },
        "dynamic_shadows[,on|off]", "get or set dynamic shadows"));

        _commands.push_back(Command("floor_color", [&](const std::string& _line){ 
            std::vector<std::string> values = vera::split(_line,',');
            if (values.size() == 4) {
                std::string str_color = "vec4("+values[1]+","+values[2]+","+values[3]+",1.0)"; 
                addDefine("FLOOR_COLOR",str_color);
                
                _uniforms.setGroundAlbedo( glm::vec3(vera::toFloat(values[1]), vera::toFloat(values[2]), vera::toFloat(values[3])) );
                _uniforms.activeCubemap = _uniforms.cubemaps["default"];
                return true;
            }
            else {
                glm::vec3 ground = _uniforms.getGroundAlbedo();
                std::cout << ground.x << ',' << ground.y << ',' << ground.z << std::endl;
                return true;
            }
            return false;
        },
        "floor_color[,<r>,<g>,<b>]", "get or set the ground color of the skybox."));
        
        _commands.push_back(Command("floor", [&](const std::string& _line) {
            std::vector<std::string> values = vera::split(_line,',');

            if (_line == "floor") {
                std::string rta = m_floor_subd > 0 ? vera::toString(m_floor_subd) : "off";
                std::cout << rta << std::endl; 
                return true;
            }
            else {
                if (values.size() == 2) {
                    if (values[1] == "toggle")
                        values[1] = m_floor_subd_target >= 0 ? "off" : "on";

                    if (values[1] == "off")
                        m_floor_subd_target = -1;
                    else if (values[1] == "on") {
                        if (m_floor_subd_target == -1)
                            m_floor_subd_target = 0;
                    }
                    else
                        m_floor_subd_target = vera::toInt(values[1]);
                    return true;
                }
            }
            return false;
        },
        "floor[,on|off|<subD_level>]", "show/hide floor or presice the subdivision level"));

        _commands.push_back(Command("grid", [&](const std::string& _line){
            if (_line == "grid") {
                std::string rta = showGrid ? "on" : "off";
                std::cout << rta << std::endl; 
                return true;
            }
            else {
                std::vector<std::string> values = vera::split(_line,',');
                if (values.size() == 2) {
                    if (values[1] == "toggle")
                        values[1] = showGrid ? "off" : "on";

                    showGrid = values[1] == "on";
                    return true;
                }
            }
            return false;
        },
        "grid[,on|off]", "show/hide grid"));

        _commands.push_back(Command("axis", [&](const std::string& _line){
            if (_line == "grid") {
                std::string rta = showAxis ? "on" : "off";
                std::cout << rta << std::endl; 
                return true;
            }
            else {
                std::vector<std::string> values = vera::split(_line,',');
                if (values.size() == 2) {
                    if (values[1] == "toggle")
                        values[1] = showAxis ? "off" : "on";

                    showAxis = values[1] == "on";
                    return true;
                }
            }
            return false;
        },
        "axis[,on|off]", "show/hide axis"));

        _commands.push_back(Command("bboxes", [&](const std::string& _line){
            if (_line == "bboxes") {
                std::string rta = showBBoxes ? "on" : "off";
                std::cout << rta << std::endl; 
                return true;
            }
            else {
                std::vector<std::string> values = vera::split(_line,',');
                if (values.size() == 2) {
                    if (values[1] == "toggle")
                        values[1] = showBBoxes ? "off" : "on";

                    showBBoxes = values[1] == "on";
                    return true;
                }
            }
            return false;
        },
        "bboxes[,on|off]", "show/hide models bounding boxes"));
        m_commands_loaded = true;
    }
}